

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

size_t crnd::crnd_msize(void *p)

{
  size_t sVar1;
  char buf [512];
  char acStack_208 [512];
  
  if (p != (void *)0x0) {
    if (((ulong)p & 7) == 0) {
      sVar1 = (*(code *)g_pMSize)(p,g_pUser_data);
      return sVar1;
    }
    sprintf(acStack_208,"%s(%u): Assertion failure: \"%s\"\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/../inc/crn_decomp.h"
            ,0x99a,"crnd_msize: bad ptr");
    puts(acStack_208);
  }
  return 0;
}

Assistant:

size_t crnd_msize(void* p)
    {
        if (!p)
            return 0;

        if ((uint32)reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnd_mem_error("crnd_msize: bad ptr");
            return 0;
        }

        return (*g_pMSize)(p, g_pUser_data);
    }